

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::Write(JSONWriter *out,aiNode *ai,bool is_elem)

{
  uint n;
  ulong uVar1;
  uint n_1;
  long lVar2;
  allocator<char> local_49;
  string local_48;
  
  JSONWriter::StartObj(out,is_elem);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"name",&local_49);
  JSONWriter::Key(out,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  JSONWriter::SimpleValue<aiString>(out,&ai->mName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"transformation",&local_49)
  ;
  JSONWriter::Key(out,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  Write(out,&ai->mTransformation,false);
  if (ai->mNumMeshes != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"meshes",&local_49);
    JSONWriter::Key(out,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    lVar2 = 0;
    JSONWriter::StartArray(out,false);
    for (uVar1 = 0; uVar1 < ai->mNumMeshes; uVar1 = uVar1 + 1) {
      JSONWriter::Element<unsigned_int>(out,(uint *)((long)ai->mMeshes + lVar2));
      lVar2 = lVar2 + 4;
    }
    JSONWriter::EndArray(out);
  }
  if (ai->mNumChildren != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"children",&local_49);
    JSONWriter::Key(out,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    JSONWriter::StartArray(out,false);
    for (uVar1 = 0; uVar1 < ai->mNumChildren; uVar1 = uVar1 + 1) {
      Write(out,ai->mChildren[uVar1],true);
    }
    JSONWriter::EndArray(out);
  }
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiNode& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mName);

    out.Key("transformation");
    Write(out, ai.mTransformation, false);

    if (ai.mNumMeshes) {
        out.Key("meshes");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumMeshes; ++n) {
            out.Element(ai.mMeshes[n]);
        }
        out.EndArray();
    }

    if (ai.mNumChildren) {
        out.Key("children");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumChildren; ++n) {
            Write(out, *ai.mChildren[n]);
        }
        out.EndArray();
    }

    out.EndObj();
}